

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall fasttext::DenseMatrix::uniform(DenseMatrix *this,real a)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  minstd_rand rng;
  linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> local_20;
  undefined1 extraout_var [56];
  
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = a;
  local_20._M_x = 1;
  if (0 < (this->super_Matrix).n_ * (this->super_Matrix).m_) {
    auVar3._8_4_ = 0x80000000;
    auVar3._0_8_ = 0x8000000080000000;
    auVar3._12_4_ = 0x80000000;
    auVar3 = vxorps_avx512vl(auVar4._0_16_,auVar3);
    lVar2 = 0;
    do {
      auVar5._0_8_ = std::
                     generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                               (&local_20);
      auVar5._8_56_ = extraout_var;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (double)a - (double)auVar3._0_4_;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (double)auVar3._0_4_;
      auVar1 = vfmadd213sd_fma(auVar5._0_16_,auVar6,auVar1);
      (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] = (float)auVar1._0_8_;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_Matrix).n_ * (this->super_Matrix).m_);
  }
  return;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < this->size(1); j++) {
    x[j] += a * at(i, j);
  }
}